

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_value_def.c
# Opt level: O0

void create_enumvaldef(upb_DefBuilder *ctx,char *prefix,
                      google_protobuf_EnumValueDescriptorProto *val_proto,
                      google_protobuf_FeatureSet *parent_features,upb_EnumDef *e,upb_EnumValueDef *v
                      )

{
  upb_EnumDef *parent;
  char *ctx_00;
  _Bool _Var1;
  int32_t iVar2;
  google_protobuf_EnumValueOptions *pgVar3;
  upb_Arena *arena;
  google_protobuf_FeatureSet *pgVar4;
  char *pcVar5;
  upb_value v_00;
  upb_StringView name_00;
  _Bool ok;
  upb_StringView name;
  char *pb;
  size_t size;
  upb_EnumValueDef *v_local;
  upb_EnumDef *e_local;
  google_protobuf_FeatureSet *parent_features_local;
  google_protobuf_EnumValueDescriptorProto *val_proto_local;
  char *prefix_local;
  upb_DefBuilder *ctx_local;
  
  size = (size_t)v;
  v_local = (upb_EnumValueDef *)e;
  e_local = (upb_EnumDef *)parent_features;
  parent_features_local = (google_protobuf_FeatureSet *)val_proto;
  val_proto_local = (google_protobuf_EnumValueDescriptorProto *)prefix;
  prefix_local = (char *)ctx;
  _Var1 = google_protobuf_EnumValueDescriptorProto_has_options(val_proto);
  if (_Var1) {
    pgVar3 = google_protobuf_EnumValueDescriptorProto_options
                       ((google_protobuf_EnumValueDescriptorProto *)parent_features_local);
    pcVar5 = google_protobuf_EnumValueOptions_serialize
                       (pgVar3,*(upb_Arena **)(prefix_local + 0x50),(size_t *)&pb);
    if (pcVar5 == (char *)0x0) {
      _upb_DefBuilder_OomErr((upb_DefBuilder *)prefix_local);
    }
    arena = _upb_DefBuilder_Arena((upb_DefBuilder *)prefix_local);
    pgVar3 = google_protobuf_EnumValueOptions_parse(pcVar5,(size_t)pb,arena);
    *(google_protobuf_EnumValueOptions **)size = pgVar3;
    if (*(long *)size == 0) {
      _upb_DefBuilder_OomErr((upb_DefBuilder *)prefix_local);
    }
  }
  else {
    *(char **)size = kUpbDefOptDefault;
  }
  pcVar5 = prefix_local;
  parent = e_local;
  pgVar4 = google_protobuf_EnumValueOptions_features(*(google_protobuf_EnumValueOptions **)size);
  pgVar4 = _upb_DefBuilder_ResolveFeatures
                     ((upb_DefBuilder *)pcVar5,(google_protobuf_FeatureSet *)parent,pgVar4);
  *(google_protobuf_FeatureSet **)(size + 8) = pgVar4;
  name_00 = google_protobuf_EnumValueDescriptorProto_name
                      ((google_protobuf_EnumValueDescriptorProto *)parent_features_local);
  *(upb_EnumValueDef **)(size + 0x10) = v_local;
  pcVar5 = _upb_DefBuilder_MakeFullName
                     ((upb_DefBuilder *)prefix_local,(char *)val_proto_local,name_00);
  *(char **)(size + 0x18) = pcVar5;
  iVar2 = google_protobuf_EnumValueDescriptorProto_number
                    ((google_protobuf_EnumValueDescriptorProto *)parent_features_local);
  ctx_00 = prefix_local;
  *(int32_t *)(size + 0x20) = iVar2;
  pcVar5 = *(char **)(size + 0x18);
  v_00 = _upb_DefType_Pack((void *)size,UPB_DEFTYPE_ENUMVAL);
  _upb_DefBuilder_Add((upb_DefBuilder *)ctx_00,pcVar5,v_00);
  _Var1 = _upb_EnumDef_Insert((upb_EnumDef *)v_local,(upb_EnumValueDef *)size,
                              *(upb_Arena **)(prefix_local + 0x48));
  if (_Var1) {
    return;
  }
  _upb_DefBuilder_OomErr((upb_DefBuilder *)prefix_local);
}

Assistant:

static void create_enumvaldef(upb_DefBuilder* ctx, const char* prefix,
                              const UPB_DESC(EnumValueDescriptorProto*)
                                  val_proto,
                              const UPB_DESC(FeatureSet*) parent_features,
                              upb_EnumDef* e, upb_EnumValueDef* v) {
  UPB_DEF_SET_OPTIONS(v->opts, EnumValueDescriptorProto, EnumValueOptions,
                      val_proto);
  v->resolved_features = _upb_DefBuilder_ResolveFeatures(
      ctx, parent_features, UPB_DESC(EnumValueOptions_features)(v->opts));

  upb_StringView name = UPB_DESC(EnumValueDescriptorProto_name)(val_proto);

  v->parent = e;  // Must happen prior to _upb_DefBuilder_Add()
  v->full_name = _upb_DefBuilder_MakeFullName(ctx, prefix, name);
  v->number = UPB_DESC(EnumValueDescriptorProto_number)(val_proto);
  _upb_DefBuilder_Add(ctx, v->full_name,
                      _upb_DefType_Pack(v, UPB_DEFTYPE_ENUMVAL));

  bool ok = _upb_EnumDef_Insert(e, v, ctx->arena);
  if (!ok) _upb_DefBuilder_OomErr(ctx);
}